

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)

{
  SW_FT_Angle SVar1;
  SW_FT_Angle *in_RDI;
  SW_FT_Int inside_side;
  SW_FT_Angle turn;
  SW_FT_StrokeBorder right;
  undefined7 in_stack_00000018;
  SW_FT_Error error;
  SW_FT_Fixed in_stack_00000030;
  SW_FT_Int in_stack_0000003c;
  SW_FT_Stroker in_stack_00000040;
  SW_FT_Fixed in_stack_00000070;
  SW_FT_Int in_stack_0000007c;
  SW_FT_Stroker in_stack_00000080;
  SW_FT_Error local_c;
  
  local_c = 0;
  if (*(char *)((long)in_RDI + 0x29) == '\0') {
    if (((in_RDI[2] == in_RDI[7]) && (in_RDI[3] == in_RDI[8])) ||
       (local_c = SW_FT_Stroker_LineTo
                            (stroker,(SW_FT_Vector *)CONCAT17(error._3_1_,in_stack_00000018)),
       local_c == 0)) {
      in_RDI[1] = in_RDI[6];
      SVar1 = SW_FT_Angle_Diff(*in_RDI,in_RDI[1]);
      if ((SVar1 == 0) ||
         ((local_c = ft_stroker_inside(in_stack_00000040,in_stack_0000003c,in_stack_00000030),
          local_c == 0 &&
          (local_c = ft_stroker_outside(in_stack_00000080,in_stack_0000007c,in_stack_00000070),
          local_c == 0)))) {
        ft_stroke_border_close((SW_FT_StrokeBorder)(in_RDI + 0xe),'\0');
        ft_stroke_border_close((SW_FT_StrokeBorder)(in_RDI + 0x13),'\x01');
      }
    }
  }
  else {
    local_c = ft_stroker_cap(stroker,CONCAT17(error._3_1_,in_stack_00000018),right._4_4_);
    if ((local_c == 0) && (local_c = ft_stroker_add_reverse_left(stroker,error._3_1_), local_c == 0)
       ) {
      in_RDI[2] = in_RDI[7];
      in_RDI[3] = in_RDI[8];
      local_c = ft_stroker_cap(stroker,CONCAT17(error._3_1_,in_stack_00000018),right._4_4_);
      if (local_c == 0) {
        ft_stroke_border_close((SW_FT_StrokeBorder)(in_RDI + 0xe),'\0');
      }
    }
  }
  return local_c;
}

Assistant:

SW_FT_Error SW_FT_Stroker_EndSubPath(SW_FT_Stroker stroker)
{
    SW_FT_Error error = 0;

    if (stroker->subpath_open) {
        SW_FT_StrokeBorder right = stroker->borders;

        /* All right, this is an opened path, we need to add a cap between */
        /* right & left, add the reverse of left, then add a final cap     */
        /* between left & right.                                           */
        error = ft_stroker_cap(stroker, stroker->angle_in, 0);
        if (error) goto Exit;

        /* add reversed points from `left' to `right' */
        error = ft_stroker_add_reverse_left(stroker, TRUE);
        if (error) goto Exit;

        /* now add the final cap */
        stroker->center = stroker->subpath_start;
        error =
            ft_stroker_cap(stroker, stroker->subpath_angle + SW_FT_ANGLE_PI, 0);
        if (error) goto Exit;

        /* Now end the right subpath accordingly.  The left one is */
        /* rewind and doesn't need further processing.             */
        ft_stroke_border_close(right, FALSE);
    } else {
        SW_FT_Angle turn;
        SW_FT_Int   inside_side;

        /* close the path if needed */
        if (stroker->center.x != stroker->subpath_start.x ||
            stroker->center.y != stroker->subpath_start.y) {
            error = SW_FT_Stroker_LineTo(stroker, &stroker->subpath_start);
            if (error) goto Exit;
        }

        /* process the corner */
        stroker->angle_out = stroker->subpath_angle;
        turn = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);

        /* no specific corner processing is required if the turn is 0 */
        if (turn != 0) {
            /* when we turn to the right, the inside side is 0 */
            inside_side = 0;

            /* otherwise, the inside side is 1 */
            if (turn < 0) inside_side = 1;

            error = ft_stroker_inside(stroker, inside_side,
                                      stroker->subpath_line_length);
            if (error) goto Exit;

            /* process the outside side */
            error = ft_stroker_outside(stroker, 1 - inside_side,
                                       stroker->subpath_line_length);
            if (error) goto Exit;
        }

        /* then end our two subpaths */
        ft_stroke_border_close(stroker->borders + 0, FALSE);
        ft_stroke_border_close(stroker->borders + 1, TRUE);
    }

Exit:
    return error;
}